

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

double fcss_seas(double *b,int pq,void *params)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  void *__ptr;
  void *__ptr_00;
  long lVar12;
  double dVar13;
  alik_css_seas_object obj;
  double *theta;
  double *phi;
  int ncond;
  int iter;
  int N;
  int j;
  int i;
  int iq;
  int ip;
  int jm;
  int offset;
  int s;
  int qs;
  int ps;
  int q;
  int p;
  double temp;
  double ssq;
  double value;
  void *params_local;
  int pq_local;
  double *b_local;
  
  temp = 0.0;
  iVar9 = *params + *(int *)((long)params + 0xc) * *(int *)((long)params + 0x10);
  iVar10 = *(int *)((long)params + 8) + *(int *)((long)params + 0xc) * *(int *)((long)params + 0x18)
  ;
  iVar1 = *(int *)((long)params + 0x28);
  iVar2 = *params;
  iVar3 = *(int *)((long)params + 0x10);
  iVar4 = *(int *)((long)params + 8);
  iVar5 = *(int *)((long)params + 0x18);
  iVar6 = *(int *)((long)params + 0xc);
  iVar7 = *(int *)((long)params + 0x50);
  iVar11 = iVar2 + iVar6 * iVar3;
  __ptr = malloc((long)iVar9 << 3);
  __ptr_00 = malloc((long)iVar10 << 3);
  for (N = 0; iVar8 = iVar2, N < iVar2; N = N + 1) {
    *(double *)((long)__ptr + (long)N * 8) = b[N];
  }
  while (N = iVar8, N < iVar9) {
    *(undefined8 *)((long)__ptr + (long)N * 8) = 0;
    iVar8 = N + 1;
  }
  for (N = 0; iVar8 = iVar4, N < iVar4; N = N + 1) {
    *(double *)((long)__ptr_00 + (long)N * 8) = b[N + iVar2];
  }
  while (N = iVar8, N < iVar10) {
    *(undefined8 *)((long)__ptr_00 + (long)N * 8) = 0;
    iVar8 = N + 1;
  }
  for (iter = 0; iter < iVar3; iter = iter + 1) {
    lVar12 = (long)((iter + 1) * iVar6 + -1);
    *(double *)((long)__ptr + lVar12 * 8) =
         b[iVar2 + iVar4 + iter] + *(double *)((long)__ptr + lVar12 * 8);
    for (N = 0; N < iVar2; N = N + 1) {
      lVar12 = (long)((iter + 1) * iVar6 + N);
      *(double *)((long)__ptr + lVar12 * 8) =
           -b[N] * b[iVar2 + iVar4 + iter] + *(double *)((long)__ptr + lVar12 * 8);
    }
  }
  for (iter = 0; iter < iVar5; iter = iter + 1) {
    lVar12 = (long)((iter + 1) * iVar6 + -1);
    *(double *)((long)__ptr_00 + lVar12 * 8) =
         b[iVar2 + iVar4 + iVar3 + iter] + *(double *)((long)__ptr_00 + lVar12 * 8);
    for (N = 0; N < iVar4; N = N + 1) {
      lVar12 = (long)((iter + 1) * iVar6 + N);
      *(double *)((long)__ptr_00 + lVar12 * 8) =
           b[N + iVar2] * b[iVar2 + iVar4 + iVar3 + iter] + *(double *)((long)__ptr_00 + lVar12 * 8)
      ;
    }
  }
  for (N = 0; N < iVar11; N = N + 1) {
    *(undefined8 *)((long)params + (long)(iVar7 + iVar1 + N) * 8 + 0x58) = 0;
  }
  if (*(int *)((long)params + 0x2c) == 1) {
    for (N = 0; N < iVar1; N = N + 1) {
      *(double *)((long)params + (long)(iVar7 + N) * 8 + 0x58) =
           *(double *)((long)params + (long)(iVar7 + iVar1 * 2 + N) * 8 + 0x58) -
           b[iVar2 + iVar4 + iVar3 + iVar5];
    }
  }
  phi._4_4_ = 0;
  for (N = iVar11; N < iVar1; N = N + 1) {
    phi._4_4_ = phi._4_4_ + 1;
    _q = *(double *)((long)params + (long)(iVar7 + N) * 8 + 0x58);
    for (iter = 0; iter < iVar9; iter = iter + 1) {
      _q = -*(double *)((long)__ptr + (long)iter * 8) *
           *(double *)((long)params + (long)(((iVar7 + N) - iter) + -1) * 8 + 0x58) + _q;
    }
    iq = iVar10;
    if (N - iVar11 < iVar10) {
      iq = N - iVar11;
    }
    for (iter = 0; iter < iq; iter = iter + 1) {
      _q = -*(double *)((long)__ptr_00 + (long)iter * 8) *
           *(double *)((long)params + (long)(((iVar7 + iVar1 + N) - iter) + -1) * 8 + 0x58) + _q;
    }
    *(double *)((long)params + (long)(iVar7 + iVar1 + N) * 8 + 0x58) = _q;
    temp = _q * _q + temp;
  }
  *(double *)((long)params + 0x40) = temp;
  dVar13 = log(temp / (double)phi._4_4_);
  *(double *)((long)params + 0x48) = dVar13 * 0.5;
  free(__ptr);
  free(__ptr_00);
  return dVar13 * 0.5;
}

Assistant:

double fcss_seas(double *b, int pq, void *params) {
	double value, ssq,temp;
	int p, q, ps, qs, s, offset,jm;
	int ip, iq, i, j, N,iter,ncond;
	double *phi, *theta;

	value = ssq =  0.0;
	
	alik_css_seas_object obj = (alik_css_seas_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);

	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	s = obj->s;
	offset = obj->offset;
	ncond = p + s* ps;

	//printf("\n %d %d %d \n", s,ps, qs);

	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);



	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	//mdisplay(theta, 1, q + s*qs);
	//mdisplay(b, 1, p + q + ps + qs);
	for (i = 0; i < ncond; ++i) {
		obj->x[offset+N + i] = 0.0;
	}

	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[offset+i] = obj->x[offset+ 2 * N + i] - b[p+q+ps+qs];
		}
	}
	iter = 0;
	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[offset+i];

		for (j = 0; j < ip; ++j) {
			temp = temp - phi[j] * obj->x[offset + i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[offset+N + i - j - 1];
		}

		obj->x[offset+N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	//printf("ssq %g %g \n", value,ssq);

	free(phi);
	free(theta);
	return value;
}